

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_expression.hpp
# Opt level: O2

BoundWindowExpression * __thiscall
duckdb::BaseExpression::Cast<duckdb::BoundWindowExpression>(BaseExpression *this)

{
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if (this->expression_class == BOUND_WINDOW) {
    return (BoundWindowExpression *)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Failed to cast expression to type - expression type mismatch",
             &local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const TARGET &Cast() const {
		if (expression_class != TARGET::TYPE) {
			throw InternalException("Failed to cast expression to type - expression type mismatch");
		}
		return reinterpret_cast<const TARGET &>(*this);
	}